

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_matcher.c
# Opt level: O0

_Bool TokenMatcher_match_Comment(TokenMatcher *token_matcher,Token *token)

{
  _Bool _Var1;
  wchar_t *text_00;
  wchar_t *text;
  Token *token_local;
  TokenMatcher *token_matcher_local;
  
  if ((token == (Token *)0x0) || (token->line == (GherkinLine *)0x0)) {
    token_matcher_local._7_1_ = false;
  }
  else {
    _Var1 = GherkinLine_start_with((GherkinLine_conflict *)token->line,L"#");
    if (_Var1) {
      text_00 = GherkinLine_copy_line_text((GherkinLine_conflict *)token->line,L'\0');
      set_token_matched(token,Token_Comment,text_00,(wchar_t *)0x0,Keyword_Type_None,L'\0',
                        (Items *)0x0);
      token_matcher_local._7_1_ = true;
    }
    else {
      token_matcher_local._7_1_ = false;
    }
  }
  return token_matcher_local._7_1_;
}

Assistant:

bool TokenMatcher_match_Comment(TokenMatcher* token_matcher, Token* token) {
    if (!token || !token->line)
        return false;
    if (GherkinLine_start_with(token->line, L"#")) {
        wchar_t* text = GherkinLine_copy_line_text(token->line, 0);
        set_token_matched(token, Token_Comment, text, 0, Keyword_Type_None, 0, 0);
        return true;
    }
    return false;
}